

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void GEO::Process::initialize(int flags)

{
  Environment *pEVar1;
  undefined8 *puVar2;
  char *pcVar3;
  long lVar4;
  clock_t cVar5;
  tms now_tms;
  tms local_30;
  
  pEVar1 = Environment::instance();
  puVar2 = (undefined8 *)operator_new(0x58);
  *(undefined4 *)(puVar2 + 1) = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  *(undefined4 *)(puVar2 + 6) = 0;
  puVar2[7] = 0;
  puVar2[8] = puVar2 + 6;
  puVar2[9] = puVar2 + 6;
  puVar2[10] = 0;
  *puVar2 = &PTR__SystemEnvironment_001a95b8;
  (*(pEVar1->super_Counted)._vptr_Counted[2])(pEVar1,puVar2);
  os_init_threads();
  pcVar3 = getenv("GEO_NO_SIGNAL_HANDLER");
  if (((flags & 1U) != 0) && (pcVar3 == (char *)0x0)) {
    os_install_signal_handlers();
  }
  enable_multithreading((bool)::(anonymous_namespace)::multithreading_enabled_);
  if (number_of_cores::result == 0) {
    lVar4 = sysconf(0x54);
    number_of_cores::result = (index_t)lVar4;
  }
  set_max_threads(number_of_cores::result);
  enable_FPE((bool)::(anonymous_namespace)::fpe_enabled_);
  enable_cancel((bool)::(anonymous_namespace)::cancel_enabled_);
  cVar5 = times(&local_30);
  ::(anonymous_namespace)::start_time_ = (double)cVar5 / 100.0;
  return;
}

Assistant:

void initialize(int flags) {

            Environment* env = Environment::instance();
            env->add_environment(new ProcessEnvironment);

            if(!os_init_threads()) {
#ifdef GEO_OPENMP
                Logger::out("Process")
                    << "Using OpenMP threads"
                    << std::endl;
                set_thread_manager(new OMPThreadManager);
#else
                Logger::out("Process")
                    << "Multithreading not supported, going monothread"
                    << std::endl;
                set_thread_manager(new MonoThreadingThreadManager);
#endif
            }

	    if(
		(::getenv("GEO_NO_SIGNAL_HANDLER") == nullptr) &&
		(flags & GEOGRAM_INSTALL_HANDLERS) != 0
	    ) {
		os_install_signal_handlers();
	    }
	    
            // Initialize Process default values
            enable_multithreading(multithreading_enabled_);
            set_max_threads(number_of_cores());
            enable_FPE(fpe_enabled_);
            enable_cancel(cancel_enabled_);

            start_time_ = SystemStopwatch::now();
        }